

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O2

void __thiscall Inst::print(Inst *this,ostream *o)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  operator<<(o,&this->tag_);
  std::operator<<(o,"(");
  uVar2 = ((long)(this->args).super__Vector_base<Arg,_std::allocator<Arg>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(this->args).super__Vector_base<Arg,_std::allocator<Arg>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x30;
  iVar1 = (int)uVar2;
  uVar3 = 0;
  uVar2 = uVar2 & 0xffffffff;
  if (iVar1 < 1) {
    uVar2 = uVar3;
  }
  for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    Arg::print((Arg *)((long)&(((this->args).super__Vector_base<Arg,_std::allocator<Arg>_>._M_impl.
                                super__Vector_impl_data._M_start)->f_).id._M_dataplus + uVar3),o);
    if ((long)uVar4 < (long)(iVar1 + -1)) {
      std::operator<<(o,",");
    }
    uVar3 = uVar3 + 0x30;
  }
  std::operator<<(o,")");
  return;
}

Assistant:

void print(std::ostream &o) const  {
        o << tag_;
        o << "(";
        const int n = args.size();
        for(int i = 0; i < n; ++i) {
            o << args[i];
            if (i < n - 1) o << ",";
        }
        o << ")";
    }